

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenEnumValDecl
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,string *enum_val)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *enum_val_local;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  local_28 = enum_val;
  enum_val_local = (string *)enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  if (((this->opts_).super_IDLOptions.prefixed_enums & 1U) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)enum_val);
  }
  else {
    Name_abi_cxx11_(&local_68,this,&enum_def->super_Definition);
    std::operator+(&local_48,&local_68,"_");
    std::operator+(__return_storage_ptr__,&local_48,local_28);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenEnumValDecl(const EnumDef &enum_def,
                             const std::string &enum_val) const {
    return opts_.prefixed_enums ? Name(enum_def) + "_" + enum_val : enum_val;
  }